

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

void gauden_print(FILE *fp,float64 ***den,uint32 ***den_idx,gauden_t *g,uint32 *inv,uint32 n_inv)

{
  uint uVar1;
  uint local_44;
  uint local_40;
  uint32 k;
  uint32 j;
  uint32 ii;
  uint32 i;
  uint32 n_inv_local;
  uint32 *inv_local;
  gauden_t *g_local;
  uint32 ***den_idx_local;
  float64 ***den_local;
  FILE *fp_local;
  
  if (inv == (uint32 *)0x0) {
    for (j = 0; j < g->n_mgau; j = j + 1) {
      for (local_40 = 0; local_40 < g->n_feat; local_40 = local_40 + 1) {
        for (local_44 = 0; local_44 < g->n_top; local_44 = local_44 + 1) {
          fprintf((FILE *)fp,"(%1u %1u %1u)= [%3u] %.2e\n",den[j][local_40][local_44],(ulong)j,
                  (ulong)local_40,(ulong)local_44,(ulong)den_idx[j][local_40][local_44]);
        }
      }
    }
  }
  else {
    for (k = 0; k < n_inv; k = k + 1) {
      uVar1 = inv[k];
      if (g->n_mgau <= uVar1) {
        __assert_fail("i < g->n_mgau",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                      ,0x58a,
                      "void gauden_print(FILE *, float64 ***, uint32 ***, gauden_t *, uint32 *, uint32)"
                     );
      }
      for (local_40 = 0; local_40 < g->n_feat; local_40 = local_40 + 1) {
        for (local_44 = 0; local_44 < g->n_top; local_44 = local_44 + 1) {
          fprintf((FILE *)fp,"(%1u %1u %1u)= [%3u] %.2e\n",den[uVar1][local_40][local_44],
                  (ulong)uVar1,(ulong)local_40,(ulong)local_44,
                  (ulong)den_idx[uVar1][local_40][local_44]);
        }
      }
    }
  }
  fflush((FILE *)fp);
  return;
}

Assistant:

void
gauden_print(FILE *fp,
	     float64 ***den,
	     uint32 ***den_idx,
	     gauden_t *g,
	     uint32 *inv,
	     uint32 n_inv)
{
    uint32 i, ii, j, k;

    if (inv == NULL) {
	for (i = 0; i < g->n_mgau; i++) {
	    for (j = 0; j < g->n_feat; j++) {
		for (k = 0; k < g->n_top; k++) {
		    fprintf(fp, "(%1u %1u %1u)= [%3u] %.2e\n",
			    i, j, k, den_idx[i][j][k], den[i][j][k]);
		}
	    }
	}
    }
    else {
	for (ii = 0; ii < n_inv; ii++) {

	    i = inv[ii];
	    assert(i < g->n_mgau);

	    for (j = 0; j < g->n_feat; j++) {
		for (k = 0; k < g->n_top; k++) {
		    fprintf(fp, "(%1u %1u %1u)= [%3u] %.2e\n",
			    i, j, k, den_idx[i][j][k], den[i][j][k]);
		}
	    }
	}
    }

    fflush(fp);
}